

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O3

bool __thiscall cmCTestCurl::InitCurl(cmCTestCurl *this)

{
  Curl_easy *data;
  Curl_easy *data_00;
  
  data = (Curl_easy *)this->Curl;
  if (data != (Curl_easy *)0x0) {
    data_00 = data;
    if (this->VerifyPeerOff == true) {
      curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
      data_00 = (Curl_easy *)this->Curl;
    }
    if (this->VerifyHostOff == true) {
      curl_easy_setopt(data_00,CURLOPT_SSL_VERIFYHOST,0);
      data_00 = (Curl_easy *)this->Curl;
    }
    if ((this->HTTPProxy)._M_string_length != 0) {
      curl_easy_setopt(data_00,CURLOPT_PROXY,(this->HTTPProxy)._M_dataplus._M_p);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_PROXYTYPE,(ulong)this->HTTPProxyType);
      data_00 = (Curl_easy *)this->Curl;
      if ((this->HTTPProxyAuth)._M_string_length != 0) {
        curl_easy_setopt(data_00,CURLOPT_PROXYUSERPWD,(this->HTTPProxyAuth)._M_dataplus._M_p);
        data_00 = (Curl_easy *)this->Curl;
      }
    }
    if (this->UseHttp10 == true) {
      curl_easy_setopt(data_00,CURLOPT_HTTP_VERSION,1);
      data_00 = (Curl_easy *)this->Curl;
    }
    curl_easy_setopt(data_00,CURLOPT_FAILONERROR,1);
    if (this->TimeOutSeconds != 0) {
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_LOW_SPEED_LIMIT,1);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_LOW_SPEED_TIME,
                       (ulong)(uint)this->TimeOutSeconds);
    }
  }
  return data != (Curl_easy *)0x0;
}

Assistant:

bool cmCTestCurl::InitCurl()
{
  if (!this->Curl) {
    return false;
  }
  if (this->VerifyPeerOff) {
    curl_easy_setopt(this->Curl, CURLOPT_SSL_VERIFYPEER, 0);
  }
  if (this->VerifyHostOff) {
    curl_easy_setopt(this->Curl, CURLOPT_SSL_VERIFYHOST, 0);
  }
  if (!this->HTTPProxy.empty()) {
    curl_easy_setopt(this->Curl, CURLOPT_PROXY, this->HTTPProxy.c_str());
    curl_easy_setopt(this->Curl, CURLOPT_PROXYTYPE, this->HTTPProxyType);
    if (!this->HTTPProxyAuth.empty()) {
      curl_easy_setopt(this->Curl, CURLOPT_PROXYUSERPWD,
                       this->HTTPProxyAuth.c_str());
    }
  }
  if (this->UseHttp10) {
    curl_easy_setopt(this->Curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_0);
  }
  // enable HTTP ERROR parsing
  curl_easy_setopt(this->Curl, CURLOPT_FAILONERROR, 1);

  // if there is little to no activity for too long stop submitting
  if (this->TimeOutSeconds) {
    curl_easy_setopt(this->Curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    curl_easy_setopt(this->Curl, CURLOPT_LOW_SPEED_TIME, this->TimeOutSeconds);
  }

  return true;
}